

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t test_filter(char *pattern,char *test)

{
  char cVar1;
  wchar_t local_34;
  char *local_30;
  char *t;
  char *p;
  wchar_t negate;
  wchar_t retval;
  char *test_local;
  char *pattern_local;
  
  p._4_4_ = L'\0';
  cVar1 = *pattern;
  local_30 = test;
  t = pattern;
  if (cVar1 == '^') {
    t = pattern + 1;
  }
  while( true ) {
    if (*t == '\\') {
      t = t + 1;
    }
    else if (*t == '*') {
      for (; *t == '*'; t = t + 1) {
      }
      if (*t == '\\') {
        t = t + 1;
      }
      local_30 = strchr(local_30,(int)*t);
      if (local_30 == (char *)0x0) goto LAB_0010646f;
    }
    if (*t != *local_30) goto LAB_0010646f;
    if (*t == '\0') break;
    t = t + 1;
    local_30 = local_30 + 1;
  }
  p._4_4_ = L'\x01';
LAB_0010646f:
  if (cVar1 == '^') {
    local_34 = (wchar_t)((p._4_4_ != L'\0' ^ 0xffU) & 1);
  }
  else {
    local_34 = p._4_4_;
  }
  return local_34;
}

Assistant:

static int
test_filter(const char *pattern, const char *test)
{
	int retval = 0;
	int negate = 0;
	const char *p = pattern;
	const char *t = test;

	if (p[0] == '^')
	{
		negate = 1;
		p++;
	}

	while (1)
	{
		if (p[0] == '\\')
			p++;
		else if (p[0] == '*')
		{
			while (p[0] == '*')
				p++;
			if (p[0] == '\\')
				p++;
			if ((t = strchr(t, p[0])) == 0)
				break;
		}
		if (p[0] != t[0])
			break;
		if (p[0] == '\0') {
			retval = 1;
			break;
		}
		p++;
		t++;
	}

	return (negate) ? !retval : retval;
}